

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O0

bool __thiscall SRUP_MSG::Sign(SRUP_MSG *this,char *key)

{
  uint16_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uchar *p_signature;
  SRUP_Crypto Crypto;
  char *key_local;
  SRUP_MSG *this_local;
  
  Crypto._32_8_ = key;
  uVar2 = (*this->_vptr_SRUP_MSG[9])();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else if (Crypto._32_8_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    this->m_is_serialized = false;
    SRUP_Crypto::SRUP_Crypto((SRUP_Crypto *)&p_signature);
    (*this->_vptr_SRUP_MSG[10])(this,1);
    puVar3 = SRUP_Crypto::Sign((SRUP_Crypto *)&p_signature,this->m_unsigned_message,
                               (ulong)this->m_unsigned_length,(char *)Crypto._32_8_);
    if (puVar3 == (uint8_t *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      puVar3 = SRUP_Crypto::signature((SRUP_Crypto *)&p_signature);
      uVar1 = SRUP_Crypto::sigLen((SRUP_Crypto *)&p_signature);
      this->m_sig_len = uVar1;
      if (this->m_signature != (uint8_t *)0x0) {
        operator_delete__(this->m_signature);
      }
      puVar4 = (uint8_t *)operator_new__((ulong)this->m_sig_len);
      this->m_signature = puVar4;
      memcpy(this->m_signature,puVar3,(ulong)this->m_sig_len);
      this_local._7_1_ = true;
    }
    SRUP_Crypto::~SRUP_Crypto((SRUP_Crypto *)&p_signature);
  }
  return this_local._7_1_;
}

Assistant:

bool SRUP_MSG::Sign(char *key)
{
    if (!DataCheck())
        return false;

    // Check to see if the key is not null before we try to do anything with it...
    if (key == nullptr)
        return false;

    m_is_serialized = false;

    SRUP_Crypto Crypto;
    unsigned char* p_signature;

    // Running Serialize with preSign = true - will set m_serialized to the byte stream to be signed...
    Serialize(true);
    if (Crypto.Sign(m_unsigned_message, m_unsigned_length, key) == nullptr)
        return false;

    p_signature = Crypto.signature();
    m_sig_len = (uint16_t) Crypto.sigLen();

    delete[] m_signature;
    m_signature = new uint8_t[m_sig_len];

    memcpy(m_signature, p_signature, m_sig_len);

    return true;
}